

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O2

void __thiscall
Lib::
Stack<std::tuple<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>_>
::expand(Stack<std::tuple<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>_>
         *this)

{
  tuple<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
  *ptVar1;
  ulong uVar2;
  size_t sVar3;
  size_t i;
  ulong uVar4;
  size_t sVar5;
  long lVar6;
  
  sVar5 = 8;
  if (this->_capacity != 0) {
    sVar5 = this->_capacity * 2;
  }
  ptVar1 = (tuple<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
            *)Lib::alloc(sVar5 * 0x30);
  uVar2 = this->_capacity;
  if (uVar2 == 0) {
    sVar3 = 0;
  }
  else {
    lVar6 = 0;
    for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
      std::
      _Tuple_impl<0UL,_Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
      ::_Tuple_impl((_Tuple_impl<0UL,_Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
                     *)((long)&(ptVar1->
                               super__Tuple_impl<0UL,_Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
                               ).super__Tuple_impl<1UL,_Kernel::IntegerConstantType>.
                               super__Head_base<1UL,_Kernel::IntegerConstantType,_false>.
                               _M_head_impl._val[0]._mp_alloc + lVar6),
                    (_Tuple_impl<0UL,_Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
                     *)((long)&(this->_stack->
                               super__Tuple_impl<0UL,_Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
                               ).super__Tuple_impl<1UL,_Kernel::IntegerConstantType>.
                               super__Head_base<1UL,_Kernel::IntegerConstantType,_false>.
                               _M_head_impl._val[0]._mp_alloc + lVar6));
      std::
      _Tuple_impl<0UL,_Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
      ::~_Tuple_impl((_Tuple_impl<0UL,_Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
                      *)((long)&(this->_stack->
                                super__Tuple_impl<0UL,_Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
                                ).super__Tuple_impl<1UL,_Kernel::IntegerConstantType>.
                                super__Head_base<1UL,_Kernel::IntegerConstantType,_false>.
                                _M_head_impl._val[0]._mp_alloc + lVar6));
      uVar2 = this->_capacity;
      lVar6 = lVar6 + 0x30;
    }
    Lib::free(this->_stack);
    sVar3 = this->_capacity;
  }
  this->_stack = ptVar1;
  this->_cursor = ptVar1 + sVar3;
  this->_end = ptVar1 + sVar5;
  this->_capacity = sVar5;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }